

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void prepbitfield(rnndb *db,rnnbitfield *bf,char *prefix,rnnvarinfo *parvi)

{
  char *b;
  char *pcVar1;
  uint64_t uVar2;
  int iVar3;
  int iVar4;
  
  pcVar1 = catstr(prefix,bf->name);
  bf->fullname = pcVar1;
  prepvarinfo(db,pcVar1,&bf->varinfo,parvi);
  if ((bf->varinfo).dead == 0) {
    if (bf->high == 0x3f) {
      iVar3 = bf->low;
      uVar2 = -1L << ((byte)iVar3 & 0x3f);
      iVar4 = 0x40;
    }
    else {
      iVar4 = bf->high + 1;
      iVar3 = bf->low;
      uVar2 = (-1L << ((byte)iVar3 & 0x3f)) + (1L << ((byte)iVar4 & 0x3f));
    }
    bf->mask = uVar2;
    preptypeinfo(db,&bf->typeinfo,bf->fullname,&bf->varinfo,iVar4 - iVar3,bf->file);
    pcVar1 = (bf->varinfo).prefix;
    if (pcVar1 != (char *)0x0) {
      b = bf->fullname;
      pcVar1 = catstr(pcVar1,b);
      bf->fullname = pcVar1;
      free(b);
      return;
    }
  }
  return;
}

Assistant:

static void prepbitfield(struct rnndb *db, struct rnnbitfield *bf, char *prefix, struct rnnvarinfo *parvi) {
	bf->fullname = catstr(prefix, bf->name);
	prepvarinfo (db, bf->fullname, &bf->varinfo, parvi);
	if (bf->varinfo.dead)
		return;
	if (bf->high == 63)
		bf->mask = - (1ULL<<bf->low);
	else
		bf->mask = (1ULL<<(bf->high+1)) - (1ULL<<bf->low);
	preptypeinfo(db, &bf->typeinfo, bf->fullname, &bf->varinfo, bf->high - bf->low + 1, bf->file);
	if (bf->varinfo.prefix) {
		char *tmp = bf->fullname;
		bf->fullname = catstr(bf->varinfo.prefix, bf->fullname);
		free(tmp);
	}
}